

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryHeap.hpp
# Opt level: O3

uint __thiscall
Lib::
BinaryHeap<FMB::FiniteModelBuilder::HackyDSAE::Constraint_Generator_*,_FMB::FiniteModelBuilder::HackyDSAE::Constraint_Generator_Compare>
::bubbleDown(BinaryHeap<FMB::FiniteModelBuilder::HackyDSAE::Constraint_Generator_*,_FMB::FiniteModelBuilder::HackyDSAE::Constraint_Generator_Compare>
             *this,uint index)

{
  uint uVar1;
  uint uVar2;
  Constraint_Generator **ppCVar3;
  Constraint_Generator *pCVar4;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  Constraint_Generator **ppCVar8;
  
  uVar6 = (ulong)index;
  uVar1 = this->_size;
  uVar5 = index * 2;
  do {
    if (uVar1 < uVar5) {
      return index;
    }
    ppCVar3 = this->_data1;
    pCVar4 = ppCVar3[uVar6];
    if (uVar5 == uVar1) {
      uVar7 = pCVar4->_weight;
LAB_0029eb81:
      if (uVar7 <= ppCVar3[uVar5]->_weight) {
        return (uint)uVar6;
      }
      ppCVar8 = ppCVar3 + uVar5;
      ppCVar3[uVar6] = ppCVar3[uVar5];
      index = uVar5;
    }
    else {
      index = uVar5 | 1;
      uVar7 = pCVar4->_weight;
      uVar2 = ppCVar3[index]->_weight;
      if (uVar7 <= uVar2) goto LAB_0029eb81;
      if (ppCVar3[uVar5]->_weight < uVar2) {
        ppCVar8 = ppCVar3 + uVar5;
        ppCVar3[uVar6] = ppCVar3[uVar5];
        index = uVar5;
      }
      else {
        ppCVar8 = ppCVar3 + index;
        ppCVar3[uVar6] = ppCVar3[index];
      }
    }
    uVar6 = (ulong)index;
    *ppCVar8 = pCVar4;
    uVar5 = index * 2;
  } while( true );
}

Assistant:

unsigned bubbleDown(unsigned index)
  {
    ASS(index>0 && index<=_size);
    unsigned nextIndex=index<<1;
    while(nextIndex<=_size) {
      if(nextIndex!=_size && Comparator::compare(_data1[index], _data1[nextIndex|1])==GREATER) {
	if(Comparator::compare(_data1[nextIndex|1], _data1[nextIndex])==GREATER) {
	  std::swap(_data1[index], _data1[nextIndex]);
	} else {
	  std::swap(_data1[index], _data1[nextIndex|1]);
	  nextIndex|=1;
	}
      } else if(Comparator::compare(_data1[index], _data1[nextIndex])==GREATER) {
	std::swap(_data1[index], _data1[nextIndex]);
      } else {
	return index;
      }
      index=nextIndex;
      nextIndex=index<<1;
    }
    return index;
  }